

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O2

char * trim(char *s)

{
  byte *pbVar1;
  byte bVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  
  for (; bVar2 = *s, (ulong)bVar2 != 0; s = (char *)((byte *)s + 1)) {
    ppuVar3 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar3 + (ulong)bVar2 * 2 + 1) & 0x20) == 0) break;
  }
  pbVar4 = (byte *)s + -2;
  do {
    pbVar1 = pbVar4 + 2;
    pbVar4 = pbVar4 + 1;
  } while (*pbVar1 != 0);
  ppuVar3 = __ctype_b_loc();
  while ((*(byte *)((long)*ppuVar3 + (ulong)*pbVar4 * 2 + 1) & 0x20) != 0) {
    *pbVar4 = 0;
    pbVar4 = pbVar4 + -1;
  }
  return (char *)(byte *)s;
}

Assistant:

char * trim( char * s )
{
    char * p;

    /* Skip over leading whitespace */
    while ( *s && isspace( (unsigned char)*s ) )
    {
        ++s;
    }

    /* Trim trailing whitespace */
    p = s;

    while ( *p )
    {
        ++p;
    }

    while ( isspace( (unsigned char)*( --p ) ) )
    {
        *p = '\0';
    }

    return s;
}